

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeccakP-1600-reference.c
# Opt level: O3

void KeccakP1600_DisplayRhoOffsets(FILE *f)

{
  uint *puVar1;
  ulong uVar2;
  ulong uVar3;
  
  puVar1 = KeccakRhoOffsets;
  uVar2 = 0;
  do {
    uVar3 = 0;
    do {
      fprintf((FILE *)f,"RhoOffset[%i][%i] = ",uVar3 & 0xffffffff,uVar2 & 0xffffffff);
      fprintf((FILE *)f,"%2i",(ulong)puVar1[uVar3]);
      fputc(10,(FILE *)f);
      uVar3 = uVar3 + 1;
    } while (uVar3 != 5);
    uVar2 = uVar2 + 1;
    puVar1 = puVar1 + 5;
  } while (uVar2 != 5);
  fputc(10,(FILE *)f);
  return;
}

Assistant:

void KeccakP1600_DisplayRhoOffsets(FILE *f)
{
    unsigned int x, y;

    for(y=0; y<5; y++) for(x=0; x<5; x++) {
        fprintf(f, "RhoOffset[%i][%i] = ", x, y);
        fprintf(f, "%2i", KeccakRhoOffsets[index(x, y)]);
        fprintf(f, "\n");
    }
    fprintf(f, "\n");
}